

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVectorBase<slang::parsing::Token>::reallocateTo
          (SmallVectorBase<slang::parsing::Token> *this,size_type newCapacity)

{
  Token *__last;
  iterator ctx;
  Token *in_RSI;
  SmallVectorBase<slang::parsing::Token> *in_RDI;
  pointer newData;
  
  __last = (Token *)operator_new(0x28a776);
  begin(in_RDI);
  ctx = end(in_RDI);
  std::uninitialized_move<slang::parsing::Token*,slang::parsing::Token*>
            (in_RSI,__last,(Token *)in_RDI);
  cleanup(in_RDI,(EVP_PKEY_CTX *)ctx);
  in_RDI->cap = (size_type)in_RSI;
  in_RDI->data_ = __last;
  return;
}

Assistant:

void reallocateTo(size_type newCapacity) {
        auto newData = (pointer)::operator new(newCapacity * sizeof(T));
        std::uninitialized_move(begin(), end(), newData);

        cleanup();
        cap = newCapacity;
        data_ = newData;
    }